

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  BYTE *iStart;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  U32 *pUVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  ulong *puVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  ulong *puVar19;
  BYTE *pBVar20;
  uint uVar21;
  ulong *puVar22;
  long lVar23;
  seqDef *psVar24;
  uint uVar25;
  BYTE *pBVar26;
  uint uVar27;
  BYTE *pBVar28;
  ulong *puVar29;
  uint uVar30;
  ulong uVar31;
  ulong *puVar32;
  U32 UVar33;
  uint uVar34;
  int iVar35;
  BYTE *pStart;
  BYTE *pStart_3;
  BYTE *pInLoopLimit;
  ulong local_158;
  ulong local_138;
  ulong *local_128;
  ulong local_120;
  ulong local_118;
  uint local_fc;
  BYTE *local_d0;
  ulong *local_c0;
  int local_7c;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar4 = (ulong *)((long)src + (srcSize - 8));
  pBVar9 = (ms->window).base;
  pBVar10 = (ms->window).dictBase;
  uVar5 = (ms->window).dictLimit;
  uVar6 = (ms->window).lowLimit;
  iStart = pBVar9 + uVar5;
  uVar30 = *rep;
  local_fc = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  puVar32 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  if (puVar4 <= puVar32) {
LAB_00434e37:
    *rep = uVar30;
    rep[1] = local_fc;
    return (long)iEnd - (long)src;
  }
  puVar15 = (ulong *)(pBVar10 + uVar5);
  iVar13 = uVar5 - 1;
  puVar1 = (ulong *)((long)iEnd - 7);
  puVar2 = (ulong *)((long)iEnd - 3);
  puVar3 = (ulong *)((long)iEnd - 1);
LAB_004338e9:
  UVar33 = (U32)puVar32;
  local_7c = UVar33 - (int)pBVar9;
  uVar14 = (local_7c - uVar30) + 1;
  pBVar28 = pBVar9;
  if (uVar14 < uVar5) {
    pBVar28 = pBVar10;
  }
  if ((uVar6 < uVar14 && 2 < iVar13 - uVar14) &&
     (*(int *)((long)puVar32 + 1U) == *(int *)(pBVar28 + uVar14))) {
    puVar22 = iEnd;
    if (uVar14 < uVar5) {
      puVar22 = puVar15;
    }
    sVar16 = ZSTD_count_2segments
                       ((BYTE *)((long)puVar32 + 5),(BYTE *)((long)(pBVar28 + uVar14) + 4),
                        (BYTE *)iEnd,(BYTE *)puVar22,iStart);
    local_d0 = (BYTE *)(sVar16 + 4);
  }
  else {
    local_d0 = (BYTE *)0x0;
  }
  uVar14 = (ms->cParams).minMatch;
  if (uVar14 - 6 < 2) {
    pUVar11 = ms->chainTable;
    uVar14 = (ms->cParams).chainLog;
    uVar27 = 1 << ((byte)uVar14 & 0x1f);
    pBVar28 = (ms->window).base;
    pBVar20 = (ms->window).dictBase;
    uVar21 = (ms->window).dictLimit;
    uVar7 = (ms->window).lowLimit;
    uVar34 = UVar33 - (int)pBVar28;
    uVar25 = uVar34 - uVar27;
    if (uVar34 < uVar27) {
      uVar25 = 0;
    }
    uVar8 = (ms->cParams).searchLog;
    uVar14 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar14,
                        (BYTE *)(ulong)(ms->cParams).hashLog,UVar33);
    if (uVar7 < uVar14) {
      iVar35 = 1 << ((byte)uVar8 & 0x1f);
      local_138 = 999999999;
      local_158 = 3;
      do {
        uVar17 = (ulong)uVar14;
        if (uVar14 < uVar21) {
          if (*(int *)(pBVar20 + uVar17) == (int)*puVar32) {
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar32 + 4),pBVar20 + uVar17 + 4,(BYTE *)iEnd,
                                pBVar20 + uVar21,pBVar28 + uVar21);
            uVar17 = sVar16 + 4;
LAB_00433bea:
            if ((local_158 < uVar17) &&
               (local_138 = (ulong)((uVar34 + 2) - uVar14), local_158 = uVar17,
               (ulong *)((long)puVar32 + uVar17) == iEnd)) goto LAB_00434158;
          }
        }
        else {
          puVar22 = (ulong *)(pBVar28 + uVar17);
          if (*(BYTE *)(local_158 + (long)puVar22) == *(BYTE *)((long)puVar32 + local_158)) {
            puVar19 = puVar32;
            if (puVar32 < puVar1) {
              if (*puVar22 == *puVar32) {
                lVar23 = 0;
                do {
                  puVar19 = (ulong *)((long)puVar32 + lVar23 + 8);
                  if (puVar1 <= puVar19) {
                    puVar22 = (ulong *)(pBVar28 + lVar23 + uVar17 + 8);
                    goto LAB_00433ba4;
                  }
                  lVar12 = lVar23 + uVar17 + 8;
                  lVar23 = lVar23 + 8;
                } while (*(ulong *)(pBVar28 + lVar12) == *puVar19);
                uVar18 = *puVar19 ^ *(ulong *)(pBVar28 + lVar12);
                uVar17 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar17 = (uVar17 >> 3 & 0x1fffffff) + lVar23;
              }
              else {
                uVar18 = *puVar32 ^ *puVar22;
                uVar17 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar17 = uVar17 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00433ba4:
              if ((puVar19 < puVar2) && ((int)*puVar22 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar22 = (ulong *)((long)puVar22 + 4);
              }
              if ((puVar19 < puVar3) && ((short)*puVar22 == (short)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar22 = (ulong *)((long)puVar22 + 2);
              }
              if (puVar19 < iEnd) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar19));
              }
              uVar17 = (long)puVar19 - (long)puVar32;
            }
            goto LAB_00433bea;
          }
        }
        if ((uVar14 <= uVar25) ||
           ((uVar14 = pUVar11[uVar14 & uVar27 - 1], uVar14 <= uVar7 ||
            (iVar35 = iVar35 + -1, iVar35 == 0)))) goto LAB_00434158;
      } while( true );
    }
  }
  else if (uVar14 == 5) {
    pUVar11 = ms->chainTable;
    uVar14 = (ms->cParams).chainLog;
    uVar27 = 1 << ((byte)uVar14 & 0x1f);
    pBVar28 = (ms->window).base;
    pBVar20 = (ms->window).dictBase;
    uVar21 = (ms->window).dictLimit;
    uVar7 = (ms->window).lowLimit;
    uVar34 = UVar33 - (int)pBVar28;
    uVar25 = uVar34 - uVar27;
    if (uVar34 < uVar27) {
      uVar25 = 0;
    }
    uVar8 = (ms->cParams).searchLog;
    uVar14 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar14,
                        (BYTE *)(ulong)(ms->cParams).hashLog,UVar33);
    if (uVar7 < uVar14) {
      iVar35 = 1 << ((byte)uVar8 & 0x1f);
      local_138 = 999999999;
      local_158 = 3;
      do {
        uVar17 = (ulong)uVar14;
        if (uVar14 < uVar21) {
          if (*(int *)(pBVar20 + uVar17) == (int)*puVar32) {
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar32 + 4),pBVar20 + uVar17 + 4,(BYTE *)iEnd,
                                pBVar20 + uVar21,pBVar28 + uVar21);
            uVar17 = sVar16 + 4;
LAB_00433e79:
            if ((local_158 < uVar17) &&
               (local_138 = (ulong)((uVar34 + 2) - uVar14), local_158 = uVar17,
               (ulong *)((long)puVar32 + uVar17) == iEnd)) goto LAB_00434158;
          }
        }
        else {
          puVar22 = (ulong *)(pBVar28 + uVar17);
          if (*(BYTE *)(local_158 + (long)puVar22) == *(BYTE *)((long)puVar32 + local_158)) {
            puVar19 = puVar32;
            if (puVar32 < puVar1) {
              if (*puVar22 == *puVar32) {
                lVar23 = 0;
                do {
                  puVar19 = (ulong *)((long)puVar32 + lVar23 + 8);
                  if (puVar1 <= puVar19) {
                    puVar22 = (ulong *)(pBVar28 + lVar23 + uVar17 + 8);
                    goto LAB_00433e33;
                  }
                  lVar12 = lVar23 + uVar17 + 8;
                  lVar23 = lVar23 + 8;
                } while (*(ulong *)(pBVar28 + lVar12) == *puVar19);
                uVar18 = *puVar19 ^ *(ulong *)(pBVar28 + lVar12);
                uVar17 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar17 = (uVar17 >> 3 & 0x1fffffff) + lVar23;
              }
              else {
                uVar18 = *puVar32 ^ *puVar22;
                uVar17 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar17 = uVar17 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00433e33:
              if ((puVar19 < puVar2) && ((int)*puVar22 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar22 = (ulong *)((long)puVar22 + 4);
              }
              if ((puVar19 < puVar3) && ((short)*puVar22 == (short)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar22 = (ulong *)((long)puVar22 + 2);
              }
              if (puVar19 < iEnd) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar19));
              }
              uVar17 = (long)puVar19 - (long)puVar32;
            }
            goto LAB_00433e79;
          }
        }
        if ((uVar14 <= uVar25) ||
           ((uVar14 = pUVar11[uVar14 & uVar27 - 1], uVar14 <= uVar7 ||
            (iVar35 = iVar35 + -1, iVar35 == 0)))) goto LAB_00434158;
      } while( true );
    }
  }
  else {
    pUVar11 = ms->chainTable;
    uVar14 = (ms->cParams).chainLog;
    uVar27 = 1 << ((byte)uVar14 & 0x1f);
    pBVar28 = (ms->window).base;
    pBVar20 = (ms->window).dictBase;
    uVar21 = (ms->window).dictLimit;
    uVar7 = (ms->window).lowLimit;
    uVar34 = UVar33 - (int)pBVar28;
    uVar25 = uVar34 - uVar27;
    if (uVar34 < uVar27) {
      uVar25 = 0;
    }
    uVar8 = (ms->cParams).searchLog;
    uVar14 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)uVar14,
                        (BYTE *)(ulong)(ms->cParams).hashLog,UVar33);
    if (uVar7 < uVar14) {
      iVar35 = 1 << ((byte)uVar8 & 0x1f);
      local_138 = 999999999;
      local_158 = 3;
      do {
        uVar17 = (ulong)uVar14;
        if (uVar14 < uVar21) {
          if (*(int *)(pBVar20 + uVar17) == (int)*puVar32) {
            sVar16 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar32 + 4),pBVar20 + uVar17 + 4,(BYTE *)iEnd,
                                pBVar20 + uVar21,pBVar28 + uVar21);
            uVar17 = sVar16 + 4;
LAB_004340ff:
            if ((local_158 < uVar17) &&
               (local_138 = (ulong)((uVar34 + 2) - uVar14), local_158 = uVar17,
               (ulong *)((long)puVar32 + uVar17) == iEnd)) goto LAB_00434158;
          }
        }
        else {
          puVar22 = (ulong *)(pBVar28 + uVar17);
          if (*(BYTE *)(local_158 + (long)puVar22) == *(BYTE *)((long)puVar32 + local_158)) {
            puVar19 = puVar32;
            if (puVar32 < puVar1) {
              if (*puVar22 == *puVar32) {
                lVar23 = 0;
                do {
                  puVar19 = (ulong *)((long)puVar32 + lVar23 + 8);
                  if (puVar1 <= puVar19) {
                    puVar22 = (ulong *)(pBVar28 + lVar23 + uVar17 + 8);
                    goto LAB_004340b9;
                  }
                  lVar12 = lVar23 + uVar17 + 8;
                  lVar23 = lVar23 + 8;
                } while (*(ulong *)(pBVar28 + lVar12) == *puVar19);
                uVar18 = *puVar19 ^ *(ulong *)(pBVar28 + lVar12);
                uVar17 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar17 = (uVar17 >> 3 & 0x1fffffff) + lVar23;
              }
              else {
                uVar18 = *puVar32 ^ *puVar22;
                uVar17 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar17 = uVar17 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_004340b9:
              if ((puVar19 < puVar2) && ((int)*puVar22 == (int)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 4);
                puVar22 = (ulong *)((long)puVar22 + 4);
              }
              if ((puVar19 < puVar3) && ((short)*puVar22 == (short)*puVar19)) {
                puVar19 = (ulong *)((long)puVar19 + 2);
                puVar22 = (ulong *)((long)puVar22 + 2);
              }
              if (puVar19 < iEnd) {
                puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar22 == (BYTE)*puVar19));
              }
              uVar17 = (long)puVar19 - (long)puVar32;
            }
            goto LAB_004340ff;
          }
        }
        if ((uVar14 <= uVar25) ||
           ((uVar14 = pUVar11[uVar14 & uVar27 - 1], uVar14 <= uVar7 ||
            (iVar35 = iVar35 + -1, iVar35 == 0)))) goto LAB_00434158;
      } while( true );
    }
  }
  local_138 = 999999999;
  local_158 = 3;
LAB_00434158:
  pBVar28 = local_d0;
  if (local_d0 < local_158) {
    pBVar28 = (BYTE *)local_158;
  }
  if (3 < pBVar28) {
    puVar22 = puVar32;
    if (local_158 <= local_d0) {
      local_138 = 0;
      puVar22 = (ulong *)((long)puVar32 + 1U);
    }
    local_d0 = (BYTE *)((long)puVar32 + 9);
LAB_004341e8:
    local_128 = puVar22;
    local_120 = local_138;
    local_118 = (ulong)pBVar28;
    if (puVar32 < puVar4) {
      puVar22 = (ulong *)((long)puVar32 + 1);
      local_7c = local_7c + 1;
      if (local_120 == 0) {
        local_120 = 0;
      }
      else {
        uVar14 = local_7c - uVar30;
        pBVar20 = pBVar9;
        if (uVar14 < uVar5) {
          pBVar20 = pBVar10;
        }
        if ((uVar6 < uVar14 && 2 < iVar13 - uVar14) &&
           (*(int *)puVar22 == *(int *)(pBVar20 + uVar14))) {
          puVar19 = iEnd;
          if (uVar14 < uVar5) {
            puVar19 = puVar15;
          }
          sVar16 = ZSTD_count_2segments
                             ((BYTE *)((long)puVar32 + 5),(BYTE *)((long)(pBVar20 + uVar14) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar19,iStart);
          if (sVar16 < 0xfffffffffffffffc) {
            uVar21 = (int)local_120 + 1;
            uVar14 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            if ((int)((uVar14 ^ 0x1f) + (int)pBVar28 * 3 + -0x1e) < (int)(sVar16 + 4) * 3) {
              local_120 = 0;
              local_128 = puVar22;
              local_118 = sVar16 + 4;
            }
          }
        }
      }
      uVar14 = (ms->cParams).minMatch;
      UVar33 = (U32)puVar22;
      local_c0 = local_128;
      if (uVar14 - 6 < 2) {
        pUVar11 = ms->chainTable;
        uVar14 = (ms->cParams).chainLog;
        uVar34 = 1 << ((byte)uVar14 & 0x1f);
        pBVar20 = (ms->window).base;
        pBVar26 = (ms->window).dictBase;
        uVar21 = (ms->window).dictLimit;
        uVar7 = (ms->window).lowLimit;
        uVar27 = UVar33 - (int)pBVar20;
        uVar25 = uVar27 - uVar34;
        if (uVar27 < uVar34) {
          uVar25 = 0;
        }
        uVar8 = (ms->cParams).searchLog;
        uVar14 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)uVar14,
                            (BYTE *)(ulong)(ms->cParams).hashLog,UVar33);
        if (uVar7 < uVar14) {
          iVar35 = 1 << ((byte)uVar8 & 0x1f);
          local_138 = 999999999;
          uVar17 = 3;
          do {
            uVar18 = (ulong)uVar14;
            if (uVar14 < uVar21) {
              if (*(int *)(pBVar26 + uVar18) == *(int *)puVar22) {
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar32 + 5),pBVar26 + uVar18 + 4,(BYTE *)iEnd,
                                    pBVar26 + uVar21,pBVar20 + uVar21);
                pBVar28 = (BYTE *)(sVar16 + 4);
LAB_00434567:
                if ((uVar17 < pBVar28) &&
                   (local_138 = (ulong)((uVar27 + 2) - uVar14), uVar17 = (ulong)pBVar28,
                   (ulong *)((long)puVar22 + (long)pBVar28) == iEnd)) goto LAB_00434ab1;
              }
            }
            else {
              puVar19 = (ulong *)(pBVar20 + uVar18);
              if (*(BYTE *)(uVar17 + (long)puVar19) == *(BYTE *)((long)puVar22 + uVar17)) {
                puVar29 = puVar22;
                if (puVar22 < puVar1) {
                  if (*puVar19 == *puVar22) {
                    lVar23 = 0;
                    do {
                      puVar29 = (ulong *)(local_d0 + lVar23);
                      if (puVar1 <= puVar29) {
                        puVar19 = (ulong *)(pBVar20 + lVar23 + uVar18 + 8);
                        goto LAB_0043451d;
                      }
                      lVar12 = lVar23 + uVar18 + 8;
                      lVar23 = lVar23 + 8;
                    } while (*(ulong *)(pBVar20 + lVar12) == *puVar29);
                    uVar31 = *puVar29 ^ *(ulong *)(pBVar20 + lVar12);
                    uVar18 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    pBVar28 = (BYTE *)((uVar18 >> 3 & 0x1fffffff) + lVar23);
                  }
                  else {
                    uVar31 = *puVar22 ^ *puVar19;
                    uVar18 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    pBVar28 = (BYTE *)(uVar18 >> 3 & 0x1fffffff);
                  }
                }
                else {
LAB_0043451d:
                  if ((puVar29 < puVar2) && ((int)*puVar19 == (int)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 4);
                    puVar19 = (ulong *)((long)puVar19 + 4);
                  }
                  if ((puVar29 < puVar3) && ((short)*puVar19 == (short)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 2);
                    puVar19 = (ulong *)((long)puVar19 + 2);
                  }
                  if (puVar29 < iEnd) {
                    puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar29));
                  }
                  pBVar28 = (BYTE *)((long)puVar29 - (long)puVar22);
                }
                goto LAB_00434567;
              }
            }
            pBVar28 = (BYTE *)uVar17;
            if ((uVar14 <= uVar25) ||
               ((uVar14 = pUVar11[uVar14 & uVar34 - 1], uVar14 <= uVar7 ||
                (iVar35 = iVar35 + -1, uVar17 = (ulong)pBVar28, iVar35 == 0)))) goto LAB_00434ab1;
          } while( true );
        }
      }
      else if (uVar14 == 5) {
        pUVar11 = ms->chainTable;
        uVar14 = (ms->cParams).chainLog;
        uVar27 = 1 << ((byte)uVar14 & 0x1f);
        pBVar20 = (ms->window).base;
        pBVar26 = (ms->window).dictBase;
        uVar21 = (ms->window).dictLimit;
        uVar7 = (ms->window).lowLimit;
        uVar34 = UVar33 - (int)pBVar20;
        uVar25 = uVar34 - uVar27;
        if (uVar34 < uVar27) {
          uVar25 = 0;
        }
        uVar8 = (ms->cParams).searchLog;
        uVar14 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)uVar14,
                            (BYTE *)(ulong)(ms->cParams).hashLog,UVar33);
        if (uVar7 < uVar14) {
          iVar35 = 1 << ((byte)uVar8 & 0x1f);
          local_138 = 999999999;
          uVar17 = 3;
          do {
            uVar18 = (ulong)uVar14;
            if (uVar14 < uVar21) {
              if (*(int *)(pBVar26 + uVar18) == *(int *)puVar22) {
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar32 + 5),pBVar26 + uVar18 + 4,(BYTE *)iEnd,
                                    pBVar26 + uVar21,pBVar20 + uVar21);
                pBVar28 = (BYTE *)(sVar16 + 4);
LAB_004347e2:
                if ((uVar17 < pBVar28) &&
                   (local_138 = (ulong)((uVar34 + 2) - uVar14), uVar17 = (ulong)pBVar28,
                   (ulong *)((long)puVar22 + (long)pBVar28) == iEnd)) goto LAB_00434ab1;
              }
            }
            else {
              puVar19 = (ulong *)(pBVar20 + uVar18);
              if (*(BYTE *)(uVar17 + (long)puVar19) == *(BYTE *)((long)puVar22 + uVar17)) {
                puVar29 = puVar22;
                if (puVar22 < puVar1) {
                  if (*puVar19 == *puVar22) {
                    lVar23 = 0;
                    do {
                      if (puVar1 <= local_d0 + lVar23) {
                        puVar19 = (ulong *)(pBVar20 + lVar23 + uVar18 + 8);
                        puVar29 = (ulong *)(local_d0 + lVar23);
                        goto LAB_0043479c;
                      }
                      lVar12 = lVar23 + uVar18 + 8;
                      uVar31 = *(ulong *)((long)puVar32 + lVar23 + 9);
                      lVar23 = lVar23 + 8;
                    } while (*(ulong *)(pBVar20 + lVar12) == uVar31);
                    uVar31 = uVar31 ^ *(ulong *)(pBVar20 + lVar12);
                    uVar18 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    pBVar28 = (BYTE *)((uVar18 >> 3 & 0x1fffffff) + lVar23);
                  }
                  else {
                    uVar31 = *puVar22 ^ *puVar19;
                    uVar18 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    pBVar28 = (BYTE *)(uVar18 >> 3 & 0x1fffffff);
                  }
                }
                else {
LAB_0043479c:
                  if ((puVar29 < puVar2) && ((int)*puVar19 == (int)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 4);
                    puVar19 = (ulong *)((long)puVar19 + 4);
                  }
                  if ((puVar29 < puVar3) && ((short)*puVar19 == (short)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 2);
                    puVar19 = (ulong *)((long)puVar19 + 2);
                  }
                  if (puVar29 < iEnd) {
                    puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar29));
                  }
                  pBVar28 = (BYTE *)((long)puVar29 - (long)puVar22);
                }
                goto LAB_004347e2;
              }
            }
            pBVar28 = (BYTE *)uVar17;
            if ((uVar14 <= uVar25) ||
               ((uVar14 = pUVar11[uVar14 & uVar27 - 1], uVar14 <= uVar7 ||
                (iVar35 = iVar35 + -1, uVar17 = (ulong)pBVar28, iVar35 == 0)))) goto LAB_00434ab1;
          } while( true );
        }
      }
      else {
        pUVar11 = ms->chainTable;
        uVar14 = (ms->cParams).chainLog;
        uVar34 = 1 << ((byte)uVar14 & 0x1f);
        pBVar20 = (ms->window).base;
        pBVar26 = (ms->window).dictBase;
        uVar21 = (ms->window).dictLimit;
        uVar7 = (ms->window).lowLimit;
        uVar27 = UVar33 - (int)pBVar20;
        uVar25 = uVar27 - uVar34;
        if (uVar27 < uVar34) {
          uVar25 = 0;
        }
        uVar8 = (ms->cParams).searchLog;
        uVar14 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)uVar14,
                            (BYTE *)(ulong)(ms->cParams).hashLog,UVar33);
        if (uVar7 < uVar14) {
          iVar35 = 1 << ((byte)uVar8 & 0x1f);
          local_138 = 999999999;
          uVar17 = 3;
          do {
            uVar18 = (ulong)uVar14;
            if (uVar14 < uVar21) {
              if (*(int *)(pBVar26 + uVar18) == *(int *)puVar22) {
                sVar16 = ZSTD_count_2segments
                                   ((BYTE *)((long)puVar32 + 5),pBVar26 + uVar18 + 4,(BYTE *)iEnd,
                                    pBVar26 + uVar21,pBVar20 + uVar21);
                pBVar28 = (BYTE *)(sVar16 + 4);
LAB_00434a72:
                if ((uVar17 < pBVar28) &&
                   (local_138 = (ulong)((uVar27 + 2) - uVar14), uVar17 = (ulong)pBVar28,
                   (ulong *)((long)puVar22 + (long)pBVar28) == iEnd)) goto LAB_00434ab1;
              }
            }
            else {
              puVar19 = (ulong *)(pBVar20 + uVar18);
              if (*(BYTE *)(uVar17 + (long)puVar19) == *(BYTE *)((long)puVar22 + uVar17)) {
                puVar29 = puVar22;
                if (puVar22 < puVar1) {
                  if (*puVar19 == *puVar22) {
                    lVar23 = 0;
                    do {
                      puVar29 = (ulong *)(local_d0 + lVar23);
                      if (puVar1 <= puVar29) {
                        puVar19 = (ulong *)(pBVar20 + lVar23 + uVar18 + 8);
                        goto LAB_00434a28;
                      }
                      lVar12 = lVar23 + uVar18 + 8;
                      lVar23 = lVar23 + 8;
                    } while (*(ulong *)(pBVar20 + lVar12) == *puVar29);
                    uVar31 = *puVar29 ^ *(ulong *)(pBVar20 + lVar12);
                    uVar18 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    pBVar28 = (BYTE *)((uVar18 >> 3 & 0x1fffffff) + lVar23);
                  }
                  else {
                    uVar31 = *puVar22 ^ *puVar19;
                    uVar18 = 0;
                    if (uVar31 != 0) {
                      for (; (uVar31 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    pBVar28 = (BYTE *)(uVar18 >> 3 & 0x1fffffff);
                  }
                }
                else {
LAB_00434a28:
                  if ((puVar29 < puVar2) && ((int)*puVar19 == (int)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 4);
                    puVar19 = (ulong *)((long)puVar19 + 4);
                  }
                  if ((puVar29 < puVar3) && ((short)*puVar19 == (short)*puVar29)) {
                    puVar29 = (ulong *)((long)puVar29 + 2);
                    puVar19 = (ulong *)((long)puVar19 + 2);
                  }
                  if (puVar29 < iEnd) {
                    puVar29 = (ulong *)((long)puVar29 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar29));
                  }
                  pBVar28 = (BYTE *)((long)puVar29 - (long)puVar22);
                }
                goto LAB_00434a72;
              }
            }
            pBVar28 = (BYTE *)uVar17;
            if ((uVar14 <= uVar25) ||
               ((uVar14 = pUVar11[uVar14 & uVar34 - 1], uVar14 <= uVar7 ||
                (iVar35 = iVar35 + -1, uVar17 = (ulong)pBVar28, iVar35 == 0)))) goto LAB_00434ab1;
          } while( true );
        }
      }
    }
    else {
      local_c0 = local_128;
    }
    goto LAB_00434ba4;
  }
  puVar32 = (ulong *)((long)puVar32 + ((long)puVar32 - (long)src >> 8) + 1);
  goto LAB_00434e26;
LAB_00434ab1:
  if (pBVar28 < 4) goto LAB_00434ba4;
  uVar21 = (int)local_120 + 1;
  uVar14 = 0x1f;
  if (uVar21 != 0) {
    for (; uVar21 >> uVar14 == 0; uVar14 = uVar14 - 1) {
    }
  }
  uVar21 = (int)local_138 + 1;
  iVar35 = 0x1f;
  if (uVar21 != 0) {
    for (; uVar21 >> iVar35 == 0; iVar35 = iVar35 + -1) {
    }
  }
  local_d0 = local_d0 + 1;
  puVar32 = puVar22;
  local_138 = local_138;
  if ((int)pBVar28 * 4 - iVar35 <= (int)((uVar14 ^ 0x1f) + (int)local_118 * 4 + -0x1b))
  goto LAB_00434ba4;
  goto LAB_004341e8;
LAB_00434ba4:
  if (local_120 == 0) {
    UVar33 = 1;
    uVar14 = uVar30;
  }
  else {
    pBVar26 = (BYTE *)((long)local_c0 + (2 - (long)(pBVar9 + local_120)));
    pBVar20 = iStart;
    pBVar28 = pBVar9;
    if ((uint)pBVar26 < uVar5) {
      pBVar20 = pBVar10 + uVar6;
      pBVar28 = pBVar10;
    }
    if ((src < local_c0) && (uVar17 = (ulong)pBVar26 & 0xffffffff, pBVar20 < pBVar28 + uVar17)) {
      pBVar28 = pBVar28 + uVar17;
      do {
        puVar32 = (ulong *)((long)local_c0 + -1);
        pBVar28 = pBVar28 + -1;
        if ((*(BYTE *)puVar32 != *pBVar28) ||
           (local_118 = local_118 + 1, local_c0 = puVar32, puVar32 <= src)) break;
      } while (pBVar20 < pBVar28);
    }
    UVar33 = (int)local_120 + 1;
    uVar14 = (int)local_120 - 2;
    local_fc = uVar30;
  }
  uVar17 = (long)local_c0 - (long)src;
  puVar22 = (ulong *)seqStore->lit;
  puVar32 = (ulong *)((long)puVar22 + uVar17);
  do {
    *puVar22 = *src;
    puVar22 = puVar22 + 1;
    src = (void *)((long)src + 8);
  } while (puVar22 < puVar32);
  seqStore->lit = seqStore->lit + uVar17;
  if (uVar17 < 0x10000) {
    psVar24 = seqStore->sequences;
  }
  else {
    seqStore->longLengthID = 1;
    psVar24 = seqStore->sequences;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar24->litLength = (U16)uVar17;
  psVar24->offset = UVar33;
  if (0xffff < local_118 - 3) {
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar24->matchLength = (U16)(local_118 - 3);
  seqStore->sequences = psVar24 + 1;
  for (src = (void *)((long)local_c0 + local_118); uVar30 = uVar14, puVar32 = (ulong *)src,
      src <= puVar4; src = (void *)((long)src + sVar16 + 4)) {
    uVar14 = (uint)((long)src - (long)(pBVar9 + local_fc));
    pBVar28 = pBVar9;
    if (uVar14 < uVar5) {
      pBVar28 = pBVar10;
    }
    if (((uVar14 <= uVar6) || (iVar13 - uVar14 < 3)) ||
       ((int)*src != *(int *)(pBVar28 + ((long)src - (long)(pBVar9 + local_fc) & 0xffffffff))))
    break;
    puVar32 = iEnd;
    if (uVar14 < uVar5) {
      puVar32 = puVar15;
    }
    sVar16 = ZSTD_count_2segments
                       ((BYTE *)((long)src + 4),
                        (BYTE *)((long)(pBVar28 +
                                       ((long)src - (long)(pBVar9 + local_fc) & 0xffffffff)) + 4),
                        (BYTE *)iEnd,(BYTE *)puVar32,iStart);
    *(ulong *)seqStore->lit = *src;
    psVar24 = seqStore->sequences;
    psVar24->litLength = 0;
    psVar24->offset = 1;
    if (0xffff < sVar16 + 1) {
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar24->matchLength = (U16)(sVar16 + 1);
    seqStore->sequences = psVar24 + 1;
    uVar14 = local_fc;
    local_fc = uVar30;
  }
LAB_00434e26:
  if (puVar4 <= puVar32) goto LAB_00434e37;
  goto LAB_004338e9;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, 0, 1);
}